

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_to_lower_bound.hpp
# Opt level: O2

void burst::
     skip_to_lower_bound<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>,long,std::less<void>>
               (undefined8 range,undefined8 goal)

{
  type tVar1;
  
  tVar1 = boost::algorithm::
          is_sorted<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>,std::less<void>>
                    ();
  if (tVar1) {
    detail::
    skip_to_lower_bound<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>,long,std::less<void>>
              (range,goal);
    return;
  }
  __assert_fail("boost::algorithm::is_sorted(range, compare)",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/range/skip_to_lower_bound.hpp"
                ,0x18,
                "void burst::skip_to_lower_bound(Range &, const Value &, Compare) [Range = boost::iterator_range<__gnu_cxx::__normal_iterator<const long *, std::vector<long>>>, Value = long, Compare = std::less<void>]"
               );
}

Assistant:

void skip_to_lower_bound (Range & range, const Value & goal, Compare compare)
    {
        BOOST_ASSERT(boost::algorithm::is_sorted(range, compare));
        detail::skip_to_lower_bound(range, goal, compare);
    }